

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompressedArrayTest.cpp
# Opt level: O3

void __thiscall
compressed_array_check_save_load_check_Test::~compressed_array_check_save_load_check_Test
          (compressed_array_check_save_load_check_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(compressed_array_check, save_load_check) {
    vector<Record> records;

    records = create_records_1();
    CompressedArray array1(records);
    array1.loads(array1.dumps());
    ASSERT_TRUE(check_same(records, array1));

    records = create_records_2();
    CompressedArray array2(records);
    array2.loads(array2.dumps());
    ASSERT_TRUE(check_same(records, array2));

    records = create_records_3();
    CompressedArray array3(records);
    array3.loads(array3.dumps());
    ASSERT_TRUE(check_same(records, array3));
}